

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O3

ze_result_t
zetGetMetricExpProcAddrTable(ze_api_version_t version,zet_metric_exp_dditable_t *pDdiTable)

{
  zet_pfnMetricDestroyExp_t p_Var1;
  ze_api_version_t *pzVar2;
  ze_result_t zVar3;
  
  pzVar2 = validation_layer::context;
  if (pDdiTable == (zet_metric_exp_dditable_t *)0x0) {
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      *(zet_pfnMetricCreateFromProgrammableExp2_t *)(validation_layer::context + 0x1d4) =
           pDdiTable->pfnCreateFromProgrammableExp2;
      pDdiTable->pfnCreateFromProgrammableExp2 =
           validation_layer::zetMetricCreateFromProgrammableExp2;
      p_Var1 = pDdiTable->pfnDestroyExp;
      *(zet_pfnMetricCreateFromProgrammableExp_t *)(pzVar2 + 0x1d0) =
           pDdiTable->pfnCreateFromProgrammableExp;
      *(zet_pfnMetricDestroyExp_t *)(pzVar2 + 0x1d2) = p_Var1;
      pDdiTable->pfnCreateFromProgrammableExp = validation_layer::zetMetricCreateFromProgrammableExp
      ;
      pDdiTable->pfnDestroyExp = validation_layer::zetMetricDestroyExp;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar3;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetMetricExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_metric_exp_dditable_t* pDdiTable            ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zetDdiTable.MetricExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreateFromProgrammableExp2               = pDdiTable->pfnCreateFromProgrammableExp2;
    pDdiTable->pfnCreateFromProgrammableExp2             = validation_layer::zetMetricCreateFromProgrammableExp2;

    dditable.pfnCreateFromProgrammableExp                = pDdiTable->pfnCreateFromProgrammableExp;
    pDdiTable->pfnCreateFromProgrammableExp              = validation_layer::zetMetricCreateFromProgrammableExp;

    dditable.pfnDestroyExp                               = pDdiTable->pfnDestroyExp;
    pDdiTable->pfnDestroyExp                             = validation_layer::zetMetricDestroyExp;

    return result;
}